

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void println(void)

{
  int iVar1;
  int local_14;
  int local_10;
  int i;
  int cnt;
  int nb;
  
  if ((((list_level != 0) && (xlist != 0)) && (asm_opt[0] != 0)) &&
     ((expand_macro == 0 || (asm_opt[1] != 0)))) {
    if (continued_line != 0) {
      strcpy(prlnbuf,tmplnbuf);
    }
    if (data_loccnt == -1) {
      fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
    }
    else {
      loadlc(data_loccnt,0);
      iVar1 = loccnt - data_loccnt;
      if ((list_level < data_level) && (3 < iVar1)) {
        fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
      }
      else {
        local_10 = 0;
        for (local_14 = 0; local_14 < iVar1; local_14 = local_14 + 1) {
          if (bank < 0xf0) {
            hexcon(2,(uint)rom[bank][data_loccnt],prlnbuf + (local_10 * 3 + 0x10));
          }
          else {
            prlnbuf[local_10 * 3 + 0x10] = '-';
            prlnbuf[local_10 * 3 + 0x11] = '-';
          }
          data_loccnt = data_loccnt + 1;
          local_10 = local_10 + 1;
          if (local_10 == data_size) {
            local_10 = 0;
            fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
            clearln();
            loadlc(data_loccnt,0);
          }
        }
        if (local_10 != 0) {
          fprintf((FILE *)lst_fp,"%s\n",prlnbuf);
        }
      }
    }
  }
  return;
}

Assistant:

void
println(void)
{
	int nb, cnt;
	int i;

	/* check if output possible */
	if (list_level == 0)
		return;
	if (!xlist || !asm_opt[OPT_LIST] || (expand_macro && !asm_opt[OPT_MACRO]))
		return;

	/* update line buffer if necessary */
	if (continued_line)
		strcpy(prlnbuf, tmplnbuf);

	/* output */
	if (data_loccnt == -1)
		/* line buffer */
		fprintf(lst_fp, "%s\n", prlnbuf);
	else {
		/* line buffer + data bytes */
		loadlc(data_loccnt, 0);

		/* number of bytes */
		nb = loccnt - data_loccnt;

		/* check level */
		if ((data_level > list_level) && (nb > 3))
			/* doesn't match */
			fprintf(lst_fp, "%s\n", prlnbuf);
		else {
			/* ok */
			cnt = 0;
			for (i = 0; i < nb; i++) {
				if (bank >= RESERVED_BANK) {
					prlnbuf[16 + (3*cnt)] = '-';
					prlnbuf[17 + (3*cnt)] = '-';
				}
				else {
					hexcon(2, rom[bank][data_loccnt], &prlnbuf[16 + (3*cnt)]);
				}
				data_loccnt++;
				cnt++;
				if (cnt == data_size) {
					cnt = 0;
					fprintf(lst_fp, "%s\n", prlnbuf);
					clearln();
					loadlc(data_loccnt, 0);
				}
			}
			if (cnt)
				fprintf(lst_fp, "%s\n", prlnbuf);
		}
	}
}